

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

logic_t __thiscall slang::SVInt::reductionAnd(SVInt *this)

{
  bool bVar1;
  uint64_t *puVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  uVar4 = (this->super_SVIntStorage).bitWidth;
  uVar3 = -(ulong)((uVar4 & 0x3f) == 0) | ~(-1L << (sbyte)(uVar4 & 0x3f));
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  if (bVar1 != true) {
    if (uVar4 < 0x41) {
      uVar7 = (this->super_SVIntStorage).field_0.val;
    }
    else {
      iVar6 = (uVar4 + 0x3f >> 6) << (bVar1 & 0x1fU);
      uVar4 = iVar6 - 1;
      if (uVar4 != 0) {
        lVar8 = 0;
        do {
          if ((this->super_SVIntStorage).field_0.pVal[lVar8] != 0xffffffffffffffff) {
            return (logic_t)'\0';
          }
          lVar8 = lVar8 + 1;
        } while (iVar6 + -1 != (int)lVar8);
      }
      uVar7 = (this->super_SVIntStorage).field_0.pVal[uVar4];
    }
    return (logic_t)(uVar7 == uVar3);
  }
  uVar5 = uVar4 + 0x3f >> 6;
  uVar4 = uVar5 - 1;
  if (uVar4 != 0) {
    puVar2 = (this->super_SVIntStorage).field_0.pVal;
    uVar7 = 0;
    do {
      if ((puVar2[uVar5 + (int)uVar7] | puVar2[uVar7]) != 0xffffffffffffffff) {
        return (logic_t)'\0';
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  puVar2 = (this->super_SVIntStorage).field_0.pVal;
  return (logic_t)(((puVar2[uVar5 * 2 - 1] | puVar2[uVar4]) == uVar3) << 7);
}

Assistant:

logic_t SVInt::reductionAnd() const {
    uint64_t mask;
    bitwidth_t bitsInMsw;
    getTopWordMask(bitsInMsw, mask);

    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words - 1; i++) {
            if ((pVal[i] | pVal[i + words]) != UINT64_MAX)
                return logic_t(false);
        }
        if ((pVal[words - 1] | pVal[words * 2 - 1]) != mask)
            return logic_t(false);
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val == mask);
    else {
        for (uint32_t i = 0; i < getNumWords() - 1; i++) {
            if (pVal[i] != UINT64_MAX)
                return logic_t(false);
        }
        return logic_t(pVal[getNumWords() - 1] == mask);
    }
}